

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBGlobalBufferTest *this,GLuint test_case_index,
          STAGES stage)

{
  STAGES SVar1;
  pointer p_Var2;
  GLuint GVar3;
  GLchar *text;
  TestError *pTVar4;
  Type *this_00;
  GLchar buffer [16];
  size_t position;
  string interface;
  string assignments;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &p_Var2[test_case_index].m_type;
  text = Utils::Type::GetGLSLTypeName(this_00);
  SVar1 = p_Var2[test_case_index].m_stage;
  if (SVar1 == stage) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&assignments,
               "    chichi       = uni_chichi;\n    bulma        = uni_bulma;\n    vegeta.trunk = uni_trunk;\n    vegeta.bra   = uni_bra;\n    goku.gohan   = uni_gohan;\n    goku.goten   = uni_goten;\n"
               ,(allocator<char> *)&interface);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&interface,
               "layout (xfb_buffer = 3) out;\n\nconst uint type_size = SIZE;\n\nlayout (                xfb_offset = 2 * type_size) flat out TYPE chichi;\nlayout (xfb_buffer = 1, xfb_offset = 0)             flat out TYPE bulma;\nlayout (xfb_buffer = 1, xfb_offset = 1 * type_size) out Vegeta {\n    TYPE trunk;\n    TYPE bra;\n} vegeta;\nlayout (                xfb_offset = 0)             out Goku {\n    TYPE gohan;\n    TYPE goten;\n} goku;\n\nlayout(binding = 0, std140) uniform block {\n    TYPE uni_chichi;\n    TYPE uni_bulma;\n    TYPE uni_trunk;\n    TYPE uni_bra;\n    TYPE uni_gohan;\n    TYPE uni_goten;\n};\n"
               ,(allocator<char> *)buffer);
    position = 0;
    GVar3 = Utils::Type::GetSize(this_00);
    sprintf(buffer,"%d",(ulong)GVar3);
    Utils::replaceToken("SIZE",&position,buffer,&interface);
    Utils::replaceAllTokens("TYPE",text,&interface);
    if (((stage != VERTEX) && (stage != TESS_EVAL)) && (stage != GEOMETRY)) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5ebe);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    Utils::replaceToken("INTERFACE",(size_t *)buffer,interface._M_dataplus._M_p,
                        __return_storage_ptr__);
    Utils::replaceToken("ASSIGNMENTS",(size_t *)buffer,assignments._M_dataplus._M_p,
                        __return_storage_ptr__);
    std::__cxx11::string::~string((string *)&interface);
    std::__cxx11::string::~string((string *)&assignments);
    return __return_storage_ptr__;
  }
  if ((SVar1 != VERTEX) && (SVar1 != TESS_EVAL)) {
    if (SVar1 != GEOMETRY) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5ef8);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (stage == VERTEX) goto LAB_0096d176;
  }
  if (stage == FRAGMENT) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    Utils::replaceAllTokens("TYPE",text,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
LAB_0096d176:
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBGlobalBufferTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* fs =
		"#version 430 core\n"
		"#extension GL_ARB_enhanced_layouts : require\n"
		"\n"
		"flat in TYPE chichi;\n"
		"flat in TYPE bulma;\n"
		"in Vegeta {\n"
		"    TYPE trunk;\n"
		"    TYPE bra;\n"
		"} vegeta;\n"
		"in Goku {\n"
		"    TYPE gohan;\n"
		"    TYPE goten;\n"
		"} goku;\n"
		"\n"
		"out vec4 fs_out;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    fs_out = vec4(1);\n"
		"    if (TYPE(1) != chichi + bulma + vegeta.trunk + vegeta.bra + goku.gohan + goku.goten)\n"
		"    {\n"
		"        fs_out = vec4(0);\n"
		"    }\n"
		"}\n"
		"\n";

	static const GLchar* gs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "layout(points)                   in;\n"
							  "layout(points, max_vertices = 1) out;\n"
							  "\n"
							  "INTERFACE"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "ASSIGNMENTS"
							  "    EmitVertex();\n"
							  "}\n"
							  "\n";

	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";

	static const GLchar* tes = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(isolines, point_mode) in;\n"
							   "\n"
							   "INTERFACE"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "ASSIGNMENTS"
							   "}\n"
							   "\n";

	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "}\n"
							  "\n";

	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "INTERFACE"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "ASSIGNMENTS"
									 "}\n"
									 "\n";

	std::string		 source;
	const _testCase& test_case = m_test_cases[test_case_index];
	const GLchar*	type_name = test_case.m_type.GetGLSLTypeName();

	if (test_case.m_stage == stage)
	{
		std::string assignments = "    chichi       = uni_chichi;\n"
								  "    bulma        = uni_bulma;\n"
								  "    vegeta.trunk = uni_trunk;\n"
								  "    vegeta.bra   = uni_bra;\n"
								  "    goku.gohan   = uni_gohan;\n"
								  "    goku.goten   = uni_goten;\n";

		std::string interface = "layout (xfb_buffer = 3) out;\n"
								"\n"
								"const uint type_size = SIZE;\n"
								"\n"
								"layout (                xfb_offset = 2 * type_size) flat out TYPE chichi;\n"
								"layout (xfb_buffer = 1, xfb_offset = 0)             flat out TYPE bulma;\n"
								"layout (xfb_buffer = 1, xfb_offset = 1 * type_size) out Vegeta {\n"
								"    TYPE trunk;\n"
								"    TYPE bra;\n"
								"} vegeta;\n"
								"layout (                xfb_offset = 0)             out Goku {\n"
								"    TYPE gohan;\n"
								"    TYPE goten;\n"
								"} goku;\n"
								"\n"
								// Uniform block must be declared with std140, otherwise each block member is not packed
								"layout(binding = 0, std140) uniform block {\n"
								"    TYPE uni_chichi;\n"
								"    TYPE uni_bulma;\n"
								"    TYPE uni_trunk;\n"
								"    TYPE uni_bra;\n"
								"    TYPE uni_gohan;\n"
								"    TYPE uni_goten;\n"
								"};\n";

		/* Prepare interface string */
		{
			GLchar		 buffer[16];
			size_t		 position  = 0;
			const GLuint type_size = test_case.m_type.GetSize();

			sprintf(buffer, "%d", type_size);

			Utils::replaceToken("SIZE", position, buffer, interface);
			Utils::replaceAllTokens("TYPE", type_name, interface);
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs;
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes;
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		/* Replace tokens */
		{
			size_t position = 0;

			Utils::replaceToken("INTERFACE", position, interface.c_str(), source);
			Utils::replaceToken("ASSIGNMENTS", position, assignments.c_str(), source);
		}
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				Utils::replaceAllTokens("TYPE", type_name, source);
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}